

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float64_primitive_asIEEEFloat64Decoded
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    sVar3 = (long)uVar1 >> 4;
  }
  else {
    sVar3 = *(sysbvm_tuple_t *)(uVar1 + 0x10);
  }
  psVar2 = sysbvm_context_allocateByteTuple(context,(context->roots).float64Type,8);
  (psVar2->field_1).pointers[0] = sVar3;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_asIEEEFloat64Decoded(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    uint64_t uint64Value = sysbvm_tuple_uint64_decode(arguments[0]);
    double floatValue = 0;
    memcpy(&floatValue, &uint64Value, 8);

    return sysbvm_tuple_float64_encode(context, floatValue);
}